

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void TestLength<unsigned_long_long>(char *length_spec)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  unsigned_long_long long_long_max;
  unsigned_long_long max;
  unsigned_long_long min;
  undefined4 in_stack_00000b18;
  undefined2 in_stack_00000b1c;
  unsigned_short in_stack_00000b1e;
  char *in_stack_00000b20;
  
  std::numeric_limits<unsigned_long_long>::min();
  uVar1 = std::numeric_limits<unsigned_long_long>::max();
  TestLength<unsigned_long_long,int>
            (in_stack_00000b20,CONCAT22(in_stack_00000b1e,in_stack_00000b1c));
  TestLength<unsigned_long_long,int>
            (in_stack_00000b20,CONCAT22(in_stack_00000b1e,in_stack_00000b1c));
  TestLength<unsigned_long_long,unsigned_long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  TestLength<unsigned_long_long,unsigned_long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  TestLength<unsigned_long_long,long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  uVar2 = std::numeric_limits<long_long>::max();
  if (uVar1 < uVar2) {
    TestLength<unsigned_long_long,long_long>
              (in_stack_00000b20,
               CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  }
  std::numeric_limits<short>::min();
  TestLength<unsigned_long_long,short>(in_stack_00000b20,in_stack_00000b1e);
  std::numeric_limits<unsigned_short>::max();
  TestLength<unsigned_long_long,unsigned_short>(in_stack_00000b20,in_stack_00000b1e);
  std::numeric_limits<int>::min();
  TestLength<unsigned_long_long,int>
            (in_stack_00000b20,CONCAT22(in_stack_00000b1e,in_stack_00000b1c));
  std::numeric_limits<int>::max();
  TestLength<unsigned_long_long,int>
            (in_stack_00000b20,CONCAT22(in_stack_00000b1e,in_stack_00000b1c));
  std::numeric_limits<unsigned_int>::min();
  TestLength<unsigned_long_long,unsigned_int>
            (in_stack_00000b20,CONCAT22(in_stack_00000b1e,in_stack_00000b1c));
  std::numeric_limits<unsigned_int>::max();
  TestLength<unsigned_long_long,unsigned_int>
            (in_stack_00000b20,CONCAT22(in_stack_00000b1e,in_stack_00000b1c));
  std::numeric_limits<long_long>::min();
  TestLength<unsigned_long_long,long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  std::numeric_limits<long_long>::max();
  TestLength<unsigned_long_long,long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  std::numeric_limits<unsigned_long_long>::min();
  TestLength<unsigned_long_long,unsigned_long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  std::numeric_limits<unsigned_long_long>::max();
  TestLength<unsigned_long_long,unsigned_long_long>
            (in_stack_00000b20,
             CONCAT26(in_stack_00000b1e,CONCAT24(in_stack_00000b1c,in_stack_00000b18)));
  return;
}

Assistant:

void TestLength(const char *length_spec) {
  T min = std::numeric_limits<T>::min(), max = std::numeric_limits<T>::max();
  TestLength<T>(length_spec, 42);
  TestLength<T>(length_spec, -42);
  TestLength<T>(length_spec, min);
  TestLength<T>(length_spec, max);
  TestLength<T>(length_spec, static_cast<long long>(min) - 1);
  unsigned long long long_long_max = std::numeric_limits<long long>::max();
  if (static_cast<unsigned long long>(max) < long_long_max)
    TestLength<T>(length_spec, static_cast<long long>(max) + 1);
  TestLength<T>(length_spec, std::numeric_limits<short>::min());
  TestLength<T>(length_spec, std::numeric_limits<unsigned short>::max());
  TestLength<T>(length_spec, std::numeric_limits<int>::min());
  TestLength<T>(length_spec, std::numeric_limits<int>::max());
  TestLength<T>(length_spec, std::numeric_limits<unsigned>::min());
  TestLength<T>(length_spec, std::numeric_limits<unsigned>::max());
  TestLength<T>(length_spec, std::numeric_limits<long long>::min());
  TestLength<T>(length_spec, std::numeric_limits<long long>::max());
  TestLength<T>(length_spec, std::numeric_limits<unsigned long long>::min());
  TestLength<T>(length_spec, std::numeric_limits<unsigned long long>::max());
}